

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  bool bVar1;
  i64 *piVar2;
  long lVar3;
  i64 iVar4;
  bool bVar5;
  bool bVar6;
  int local_70;
  int local_6c;
  int local_64;
  i64 *piStack_60;
  int jj;
  char *zEnd;
  char *zStart;
  int rc;
  int nonNum;
  int c;
  int i;
  int neg;
  u64 u;
  int incr;
  u8 enc_local;
  int length_local;
  i64 *pNum_local;
  char *zNum_local;
  
  _i = 0;
  bVar1 = false;
  rc = 0;
  bVar5 = false;
  lVar3 = (long)length;
  if (enc == '\x01') {
    u._4_4_ = 1;
    pNum_local = (i64 *)zNum;
  }
  else {
    u._4_4_ = 2;
    nonNum = 3 - (uint)enc;
    while( true ) {
      bVar5 = false;
      if (nonNum < length) {
        bVar5 = zNum[nonNum] == '\0';
      }
      if (!bVar5) break;
      nonNum = nonNum + 2;
    }
    bVar5 = nonNum < length;
    lVar3 = (long)(int)(nonNum ^ 1);
    pNum_local = (i64 *)(zNum + (int)(enc & 1));
  }
  piStack_60 = (i64 *)(zNum + lVar3);
  while( true ) {
    bVar6 = false;
    if (pNum_local < piStack_60) {
      bVar6 = (""[(byte)*pNum_local] & 1) != 0;
    }
    if (!bVar6) break;
    pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
  }
  piVar2 = pNum_local;
  if (pNum_local < piStack_60) {
    if ((char)*pNum_local == '-') {
      bVar1 = true;
      pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
      piVar2 = pNum_local;
    }
    else if ((char)*pNum_local == '+') {
      pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
      piVar2 = pNum_local;
    }
  }
  while( true ) {
    bVar6 = false;
    if (pNum_local < piStack_60) {
      bVar6 = (char)*pNum_local == '0';
    }
    if (!bVar6) break;
    pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
  }
  nonNum = 0;
  while( true ) {
    bVar6 = false;
    if ((i64 *)((long)pNum_local + (long)nonNum) < piStack_60) {
      rc = (int)*(char *)((long)pNum_local + (long)nonNum);
      bVar6 = false;
      if (0x2f < rc) {
        bVar6 = rc < 0x3a;
      }
    }
    if (!bVar6) break;
    _i = (_i * 10 + (long)rc) - 0x30;
    nonNum = u._4_4_ + nonNum;
  }
  if (_i < 0x8000000000000000) {
    if (bVar1) {
      *pNum = -_i;
    }
    else {
      *pNum = _i;
    }
  }
  else {
    iVar4 = 0x7fffffffffffffff;
    if (bVar1) {
      iVar4 = -0x8000000000000000;
    }
    *pNum = iVar4;
  }
  zStart._4_4_ = 0;
  if (((nonNum == 0) && (piVar2 == pNum_local)) || (bVar5)) {
    zStart._4_4_ = 1;
  }
  else if ((i64 *)((long)pNum_local + (long)nonNum) < piStack_60) {
    local_64 = nonNum;
    do {
      if ((""[*(byte *)((long)pNum_local + (long)local_64)] & 1) == 0) {
        zStart._4_4_ = 1;
        break;
      }
      local_64 = u._4_4_ + local_64;
    } while ((i64 *)((long)pNum_local + (long)local_64) < piStack_60);
  }
  if (SBORROW4(nonNum,u._4_4_ * 0x13) == nonNum + u._4_4_ * -0x13 < 0) {
    if (nonNum == u._4_4_ * 0x13 || SBORROW4(nonNum,u._4_4_ * 0x13) != nonNum + u._4_4_ * -0x13 < 0)
    {
      local_6c = compare2pow63((char *)pNum_local,u._4_4_);
    }
    else {
      local_6c = 1;
    }
    if (local_6c < 0) {
      zNum_local._4_4_ = zStart._4_4_;
    }
    else {
      iVar4 = 0x7fffffffffffffff;
      if (bVar1) {
        iVar4 = -0x8000000000000000;
      }
      *pNum = iVar4;
      if (local_6c < 1) {
        if (bVar1) {
          local_70 = zStart._4_4_;
        }
        else {
          local_70 = 3;
        }
        zNum_local._4_4_ = local_70;
      }
      else {
        zNum_local._4_4_ = 2;
      }
    }
  }
  else {
    zNum_local._4_4_ = zStart._4_4_;
  }
  return zNum_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( (i==0 && zStart==zNum)     /* No digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}